

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int gdTransformAffineBoundingBox(gdRectPtr src,double *affine,gdRectPtr bbox)

{
  int iVar1;
  double dVar2;
  int local_9c;
  undefined1 auStack_98 [4];
  int i;
  gdPointF point;
  gdPointF max;
  gdPointF min;
  gdPointF extent [4];
  gdRectPtr bbox_local;
  double *affine_local;
  gdRectPtr src_local;
  
  extent[3].y = (double)bbox;
  extent[0].x = 0.0;
  extent[0].y = (double)src->width;
  extent[1].x = 0.0;
  extent[1].y = (double)src->width;
  extent[2].x = (double)src->height;
  extent[2].y = 0.0;
  extent[3].x = (double)src->height;
  local_9c = 0;
  while( true ) {
    if (3 < local_9c) {
      max.y = 0.0;
      min.x = extent[0].x;
      point.y = 0.0;
      max.x = extent[0].x;
      for (local_9c = 1; local_9c < 4; local_9c = local_9c + 1) {
        if (extent[(long)local_9c + -1].y <= max.y && max.y != extent[(long)local_9c + -1].y) {
          max.y = extent[(long)local_9c + -1].y;
        }
        if (extent[local_9c].x <= min.x && min.x != extent[local_9c].x) {
          min.x = extent[local_9c].x;
        }
        if (point.y < extent[(long)local_9c + -1].y) {
          point.y = extent[(long)local_9c + -1].y;
        }
        if (max.x < extent[local_9c].x) {
          max.x = extent[local_9c].x;
        }
      }
      *(int *)extent[3].y = (int)max.y;
      *(int *)((long)extent[3].y + 4) = (int)min.x;
      dVar2 = ceil(point.y - max.y);
      *(int *)((long)extent[3].y + 8) = (int)dVar2 + 1;
      dVar2 = ceil(max.x - min.x);
      *(int *)((long)extent[3].y + 0xc) = (int)dVar2 + 1;
      return 1;
    }
    _auStack_98 = extent[(long)local_9c + -1].y;
    point.x = extent[local_9c].x;
    iVar1 = gdAffineApplyToPointF
                      ((gdPointFPtr)&extent[(long)local_9c + -1].y,(gdPointFPtr)auStack_98,affine);
    if (iVar1 != 1) break;
    local_9c = local_9c + 1;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineBoundingBox(gdRectPtr src, const double affine[6], gdRectPtr bbox)
{
	gdPointF extent[4], min, max, point;
	int i;

	extent[0].x=0.0;
	extent[0].y=0.0;
	extent[1].x=(double) src->width;
	extent[1].y=0.0;
	extent[2].x=(double) src->width;
	extent[2].y=(double) src->height;
	extent[3].x=0.0;
	extent[3].y=(double) src->height;

	for (i=0; i < 4; i++) {
		point=extent[i];
		if (gdAffineApplyToPointF(&extent[i], &point, affine) != GD_TRUE) {
			return GD_FALSE;
		}
	}
	min=extent[0];
	max=extent[0];

	for (i=1; i < 4; i++) {
		if (min.x > extent[i].x)
			min.x=extent[i].x;
		if (min.y > extent[i].y)
			min.y=extent[i].y;
		if (max.x < extent[i].x)
			max.x=extent[i].x;
		if (max.y < extent[i].y)
			max.y=extent[i].y;
	}
	bbox->x = (int) min.x;
	bbox->y = (int) min.y;
	bbox->width  = (int) ceil((max.x - min.x)) + 1;
	bbox->height = (int) ceil(max.y - min.y) + 1;

	return GD_TRUE;
}